

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall front::irGenerator::irGenerator::ir_end_of_program(irGenerator *this)

{
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string returnTmp;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  getNewTmpValueName_abi_cxx11_(&returnTmp,this,Int);
  std::__cxx11::string::string((string *)&local_78,(string *)&returnTmp);
  std::__cxx11::string::string((string *)&local_b8,(string *)&this->_GlobalInitFuncName);
  getFunctionName(&local_98,this,&local_b8);
  local_d8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ir_function_call(this,&local_78,INT,&local_98,&local_d8,false);
  std::
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<std::__cxx11::string&>
            ((_Optional_payload_base<std::__cxx11::string> *)&local_38,&returnTmp);
  ir_jump(this,Return,-1,-1,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38,Undefined);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_38);
  ir_leave_function(this);
  std::__cxx11::string::~string((string *)&returnTmp);
  return;
}

Assistant:

void irGenerator::ir_end_of_program() {
  string returnTmp = getNewTmpValueName(mir::types::TyKind::Int);
  ir_function_call(returnTmp, front::symbol::SymbolKind::INT,
                   getFunctionName(_GlobalInitFuncName), {});
  ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, returnTmp,
          mir::inst::JumpKind::Undefined);
  ir_leave_function();
}